

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall
chrono::ChSystemDescriptor::BuildDiagonalVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *Diagonal_vect)

{
  pointer ppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ChVariables *pCVar5;
  pointer ppCVar6;
  double *pdVar7;
  ChConstraint *pCVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  iVar9 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar9;
  iVar9 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar9;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar9 + (long)this->n_q);
  lVar12 = (Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
           .m_rows;
  if (lVar12 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar12 != 0) {
    memset((Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
           .m_data,0,lVar12 << 3);
  }
  ppCVar1 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar4 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)(this->vstiffness).
                 super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(this->vstiffness).
                 super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar11 = 0;
    do {
      if ((Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows < 0 &&
          (Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_data != (double *)0x0) goto LAB_007933f1;
      (*(this->vstiffness).
        super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11]->_vptr_ChKblock[5])();
      lVar11 = lVar11 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
  }
  if (ppCVar4 != ppCVar1) {
    lVar12 = (long)ppCVar4 - (long)ppCVar1 >> 3;
    lVar11 = 0;
    do {
      pCVar5 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11];
      if (pCVar5->disabled == false) {
        if ((Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows < 0 &&
            (Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_data != (double *)0x0) {
LAB_007933f1:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*pCVar5->_vptr_ChVariables[8])(this->c_a);
      }
      lVar11 = lVar11 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar11);
  }
  iVar9 = this->n_q;
  if (ppCVar3 != ppCVar2) {
    ppCVar6 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    lVar11 = (long)ppCVar3 - (long)ppCVar2 >> 3;
    lVar12 = 0;
    do {
      pCVar8 = ppCVar6[lVar12];
      if (pCVar8->active == true) {
        lVar10 = (long)pCVar8->offset + (long)iVar9;
        if (((int)lVar10 < 0) ||
           ((Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows <= lVar10)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        pdVar7[lVar10] = pCVar8->cfm_i;
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  return iVar9 + this->n_c;
}

Assistant:

int ChSystemDescriptor::BuildDiagonalVector(ChVectorDynamic<>& Diagonal_vect) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();
    Diagonal_vect.setZero(n_q + n_c);

    auto vs_size = vstiffness.size();
    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // Fill the diagonal values given by ChKblock objects , if any
    // (This cannot be easily parallelized because of possible write concurrency).
    for (size_t is = 0; is < vs_size; is++) {
        vstiffness[is]->DiagonalAdd(Diagonal_vect);
    }

    // Get the 'M' diagonal terms given by ChVariables objects
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->DiagonalAdd(Diagonal_vect, c_a);
        }
    }

    // Get the 'E' diagonal terms (E_i = cfm_i )
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            Diagonal_vect(vconstraints[ic]->GetOffset() + n_q) = vconstraints[ic]->Get_cfm_i();
        }
    }

    return n_q + n_c;
}